

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_deserialize_field
          (t_cpp_generator *this,ostream *out,t_field *tfield,string *prefix,string *suffix)

{
  pointer pcVar1;
  int iVar2;
  t_struct *tstruct;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *pcVar5;
  string *this_00;
  t_base_type *this_01;
  undefined1 auVar6 [12];
  string t;
  string name;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  tstruct = (t_struct *)t_type::get_true_type(tfield->type_);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[4])(tstruct);
  if ((char)iVar2 != '\0') {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(&name,"CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(pbVar4,&name,&tfield->name_);
    __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  std::operator+(&t,prefix,&tfield->name_);
  std::operator+(&name,&t,suffix);
  std::__cxx11::string::~string((string *)&t);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xb])(tstruct);
  if (((char)iVar2 == '\0') &&
     (iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xc])(tstruct), (char)iVar2 == '\0')
     ) {
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xd])(tstruct);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
      if ((char)iVar2 != '\0') {
        poVar3 = t_generator::indent((t_generator *)this,out);
        std::operator<<(poVar3,"xfer += iprot->");
        this_01 = (t_base_type *)
                  (ulong)*(uint *)&(tstruct->members_).
                                   super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
                                   .super__Vector_impl_data._M_start;
        switch(this_01) {
        case (t_base_type *)0x0:
          pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          std::operator+(pbVar4,"compiler error: cannot serialize void field in a struct: ",&name);
          __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        case (t_base_type *)0x1:
          iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[7])(tstruct);
          pcVar5 = "readString(";
          if ((char)iVar2 != '\0') {
            pcVar5 = "readBinary(";
          }
          break;
        case (t_base_type *)0x2:
          pcVar5 = "readBool(";
          break;
        case (t_base_type *)0x3:
          pcVar5 = "readByte(";
          break;
        case (t_base_type *)0x4:
          pcVar5 = "readI16(";
          break;
        case (t_base_type *)0x5:
          pcVar5 = "readI32(";
          break;
        case (t_base_type *)0x6:
          pcVar5 = "readI64(";
          break;
        case (t_base_type *)0x7:
          pcVar5 = "readDouble(";
          break;
        default:
          auVar6 = __cxa_allocate_exception(0x20);
          t_base_type::t_base_name_abi_cxx11_(&local_110,this_01,auVar6._8_4_);
          std::operator+(&t,"compiler error: no C++ reader for base type ",&local_110);
          std::operator+(auVar6._0_8_,&t,&name);
          __cxa_throw(auVar6._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        poVar3 = std::operator<<(out,pcVar5);
        poVar3 = std::operator<<(poVar3,(string *)&name);
        std::operator<<(poVar3,");");
        std::operator<<(out,(string *)&::endl_abi_cxx11_);
        goto LAB_00172eb6;
      }
      iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct);
      if ((char)iVar2 == '\0') {
        pcVar1 = (tfield->name_)._M_dataplus._M_p;
        type_name_abi_cxx11_(&t,this,(t_type *)tstruct,false,false);
        this_00 = &t;
        printf("DO NOT KNOW HOW TO DESERIALIZE FIELD \'%s\' TYPE \'%s\'\n",pcVar1,t._M_dataplus._M_p
              );
      }
      else {
        std::__cxx11::string::string((string *)&local_90,"ecast",(allocator *)&local_110);
        t_generator::tmp(&t,(t_generator *)this,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
        poVar3 = std::operator<<(out,(string *)&local_110);
        poVar3 = std::operator<<(poVar3,"int32_t ");
        poVar3 = std::operator<<(poVar3,(string *)&t);
        poVar3 = std::operator<<(poVar3,";");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
        poVar3 = std::operator<<(poVar3,(string *)&local_b0);
        poVar3 = std::operator<<(poVar3,"xfer += iprot->readI32(");
        poVar3 = std::operator<<(poVar3,(string *)&t);
        poVar3 = std::operator<<(poVar3,");");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
        poVar3 = std::operator<<(poVar3,(string *)&local_d0);
        poVar3 = std::operator<<(poVar3,(string *)&name);
        poVar3 = std::operator<<(poVar3," = static_cast<");
        type_name_abi_cxx11_(&local_f0,this,(t_type *)tstruct,false,false);
        poVar3 = std::operator<<(poVar3,(string *)&local_f0);
        poVar3 = std::operator<<(poVar3,">(");
        poVar3 = std::operator<<(poVar3,(string *)&t);
        poVar3 = std::operator<<(poVar3,");");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_110);
        this_00 = &t;
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_70,(string *)&name);
      generate_deserialize_container(this,out,(t_type *)tstruct,&local_70);
      this_00 = &local_70;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_50,(string *)&name);
    generate_deserialize_struct(this,out,tstruct,&local_50,tfield->reference_);
    this_00 = &local_50;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_00172eb6:
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void t_cpp_generator::generate_deserialize_field(ostream& out,
                                                 t_field* tfield,
                                                 string prefix,
                                                 string suffix) {
  t_type* type = get_true_type(tfield->get_type());

  if (type->is_void()) {
    throw "CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  string name = prefix + tfield->get_name() + suffix;

  if (type->is_struct() || type->is_xception()) {
    generate_deserialize_struct(out, (t_struct*)type, name, is_reference(tfield));
  } else if (type->is_container()) {
    generate_deserialize_container(out, type, name);
  } else if (type->is_base_type()) {
    indent(out) << "xfer += iprot->";
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      throw "compiler error: cannot serialize void field in a struct: " + name;
      break;
    case t_base_type::TYPE_STRING:
      if (type->is_binary()) {
        out << "readBinary(" << name << ");";
      } else {
        out << "readString(" << name << ");";
      }
      break;
    case t_base_type::TYPE_BOOL:
      out << "readBool(" << name << ");";
      break;
    case t_base_type::TYPE_I8:
      out << "readByte(" << name << ");";
      break;
    case t_base_type::TYPE_I16:
      out << "readI16(" << name << ");";
      break;
    case t_base_type::TYPE_I32:
      out << "readI32(" << name << ");";
      break;
    case t_base_type::TYPE_I64:
      out << "readI64(" << name << ");";
      break;
    case t_base_type::TYPE_DOUBLE:
      out << "readDouble(" << name << ");";
      break;
    default:
      throw "compiler error: no C++ reader for base type " + t_base_type::t_base_name(tbase) + name;
    }
    out << endl;
  } else if (type->is_enum()) {
    string t = tmp("ecast");
    out << indent() << "int32_t " << t << ";" << endl << indent() << "xfer += iprot->readI32(" << t
        << ");" << endl << indent() << name << " = static_cast<" 
        << type_name(type) << ">(" << t << ");" << endl;
  } else {
    printf("DO NOT KNOW HOW TO DESERIALIZE FIELD '%s' TYPE '%s'\n",
           tfield->get_name().c_str(),
           type_name(type).c_str());
  }
}